

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# match_results.hpp
# Opt level: O1

case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
* __thiscall
boost::xpressive::match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>::
format_backref_<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::__cxx11::string>,char>>
          (case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
           *__return_storage_ptr__,
          match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>> *this,
          __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *cur,__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               end,case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
                   out)

{
  sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  byte *pbVar1;
  int iVar2;
  const_reference pvVar3;
  byte bVar4;
  long lVar5;
  size_type index;
  char *pcVar6;
  case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
  local_48;
  
  pbVar1 = (byte *)cur->_M_current;
  local_48._16_8_ = out._16_8_;
  if (pbVar1 == (byte *)end._M_current) {
    bVar4 = 0x24;
LAB_0013eff7:
    local_48.traits_ = out.traits_;
    local_48.out_.container = out.out_.container;
    out.next_ = op_none;
    detail::
    case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
    ::operator=(&local_48,bVar4);
  }
  else {
    bVar4 = *pbVar1;
    if (bVar4 < 0x27) {
      if (bVar4 == 0x24) {
        cur->_M_current = (char *)(pbVar1 + 1);
        bVar4 = *pbVar1;
        goto LAB_0013eff7;
      }
      if (bVar4 == 0x26) {
        cur->_M_current = (char *)(pbVar1 + 1);
        pvVar3 = detail::
                 sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(this + 8),0);
        pcVar6 = (pvVar3->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current;
        pvVar3 = detail::
                 sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(this + 8),0);
        local_48.out_.container = out.out_.container;
        local_48.traits_ = out.traits_;
        lVar5 = (long)(pvVar3->
                      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ).second._M_current - (long)pcVar6;
        if (0 < lVar5) {
          lVar5 = lVar5 + 1;
          do {
            detail::
            case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
            ::operator=(&local_48,*pcVar6);
            pcVar6 = pcVar6 + 1;
            local_48._16_8_ = local_48._16_8_ & 0xffffffff00000000;
            lVar5 = lVar5 + -1;
          } while (1 < lVar5);
        }
      }
      else {
LAB_0013ed6b:
        iVar2 = (**(code **)(**(long **)(this + 0x80) + 0x28))
                          (*(long **)(this + 0x80),(int)(char)bVar4,10);
        if (iVar2 == -1) {
          local_48.out_.container = out.out_.container;
          local_48.traits_ = out.traits_;
          detail::
          case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
          ::operator=(&local_48,'$');
          pbVar1 = (byte *)cur->_M_current;
          cur->_M_current = (char *)(pbVar1 + 1);
          bVar4 = *pbVar1;
          local_48._16_8_ = (ulong)out.rest_ << 0x20;
          goto LAB_0013eff7;
        }
        this_00 = (sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)(this + 8);
        iVar2 = detail::
                toi<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::traits<char>>
                          (cur,end,*(traits<char> **)(this + 0x80),10,*(int *)(this + 8) + -1);
        detail::ensure_(iVar2 != 0,error_subreg,"invalid back-reference",
                        "OutputIterator boost::xpressive::match_results<__gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::format_backref_(ForwardIterator &, ForwardIterator, OutputIterator) const [BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, ForwardIterator = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>, OutputIterator = boost::xpressive::detail::case_converting_iterator<std::back_insert_iterator<std::basic_string<char>>, char>]"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O1/KWStyle/Utilities/boost/xpressive/match_results.hpp"
                        ,0x48a);
        index = (size_type)iVar2;
        pvVar3 = detail::
                 sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](this_00,index);
        if (pvVar3->matched != true) goto LAB_0013effc;
        pvVar3 = detail::
                 sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](this_00,index);
        pcVar6 = (pvVar3->
                 super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ).first._M_current;
        pvVar3 = detail::
                 sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](this_00,index);
        local_48.out_.container = out.out_.container;
        local_48.traits_ = out.traits_;
        lVar5 = (long)(pvVar3->
                      super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ).second._M_current - (long)pcVar6;
        if (0 < lVar5) {
          lVar5 = lVar5 + 1;
          do {
            detail::
            case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
            ::operator=(&local_48,*pcVar6);
            pcVar6 = pcVar6 + 1;
            local_48._16_8_ = local_48._16_8_ & 0xffffffff00000000;
            lVar5 = lVar5 + -1;
          } while (1 < lVar5);
        }
      }
    }
    else if (bVar4 == 0x27) {
      cur->_M_current = (char *)(pbVar1 + 1);
      if (this[0x48] ==
          (match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>)0x1) {
        pvVar3 = (const_reference)(this + 0x50);
      }
      else {
        pvVar3 = detail::
                 sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(this + 8),*(size_type *)(this + 8));
      }
      pcVar6 = (pvVar3->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).first._M_current;
      if (this[0x48] ==
          (match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>)0x1) {
        pvVar3 = (const_reference)(this + 0x50);
      }
      else {
        pvVar3 = detail::
                 sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(this + 8),*(size_type *)(this + 8));
      }
      local_48.out_.container = out.out_.container;
      local_48.traits_ = out.traits_;
      lVar5 = (long)(pvVar3->
                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).second._M_current - (long)pcVar6;
      if (0 < lVar5) {
        lVar5 = lVar5 + 1;
        do {
          detail::
          case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
          ::operator=(&local_48,*pcVar6);
          pcVar6 = pcVar6 + 1;
          local_48._16_8_ = local_48._16_8_ & 0xffffffff00000000;
          lVar5 = lVar5 + -1;
        } while (1 < lVar5);
      }
    }
    else {
      if (bVar4 != 0x60) goto LAB_0013ed6b;
      cur->_M_current = (char *)(pbVar1 + 1);
      if (this[0x28] ==
          (match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>)0x1) {
        pvVar3 = (const_reference)(this + 0x30);
      }
      else {
        pvVar3 = detail::
                 sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(this + 8),*(size_type *)(this + 8));
      }
      pcVar6 = (pvVar3->
               super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ).first._M_current;
      if (this[0x28] ==
          (match_results<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>)0x1) {
        pvVar3 = (const_reference)(this + 0x30);
      }
      else {
        pvVar3 = detail::
                 sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((sub_match_vector<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(this + 8),*(size_type *)(this + 8));
      }
      local_48.out_.container = out.out_.container;
      local_48.traits_ = out.traits_;
      lVar5 = (long)(pvVar3->
                    super_pair<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ).second._M_current - (long)pcVar6;
      if (0 < lVar5) {
        lVar5 = lVar5 + 1;
        do {
          detail::
          case_converting_iterator<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>
          ::operator=(&local_48,*pcVar6);
          pcVar6 = pcVar6 + 1;
          local_48._16_8_ = local_48._16_8_ & 0xffffffff00000000;
          lVar5 = lVar5 + -1;
        } while (1 < lVar5);
      }
    }
    out.next_ = local_48.next_;
    out.rest_ = local_48.rest_;
    out.out_.container = local_48.out_.container;
    out.traits_ = local_48.traits_;
  }
LAB_0013effc:
  __return_storage_ptr__->next_ = out.next_;
  __return_storage_ptr__->rest_ = out.rest_;
  (__return_storage_ptr__->out_).container = out.out_.container;
  __return_storage_ptr__->traits_ = out.traits_;
  return __return_storage_ptr__;
}

Assistant:

OutputIterator format_backref_
    (
        ForwardIterator &cur
      , ForwardIterator end
      , OutputIterator out
    ) const
    {
        if(cur == end)
        {
            *out++ = BOOST_XPR_CHAR_(char_type, '$');
        }
        else if(BOOST_XPR_CHAR_(char_type, '$') == *cur)
        {
            *out++ = *cur++;
        }
        else if(BOOST_XPR_CHAR_(char_type, '&') == *cur) // whole match
        {
            ++cur;
            out = std::copy(this->sub_matches_[ 0 ].first, this->sub_matches_[ 0 ].second, out);
        }
        else if(BOOST_XPR_CHAR_(char_type, '`') == *cur) // prefix
        {
            ++cur;
            out = std::copy(this->prefix().first, this->prefix().second, out);
        }
        else if(BOOST_XPR_CHAR_(char_type, '\'') == *cur) // suffix
        {
            ++cur;
            out = std::copy(this->suffix().first, this->suffix().second, out);
        }
        else if(-1 != this->traits_->value(*cur, 10)) // a sub-match
        {
            int max = static_cast<int>(this->size() - 1);
            int sub = detail::toi(cur, end, *this->traits_, 10, max);
            BOOST_XPR_ENSURE_(0 != sub, regex_constants::error_subreg, "invalid back-reference");
            if(this->sub_matches_[ sub ].matched)
                out = std::copy(this->sub_matches_[ sub ].first, this->sub_matches_[ sub ].second, out);
        }
        else
        {
            *out++ = BOOST_XPR_CHAR_(char_type, '$');
            *out++ = *cur++;
        }

        return out;
    }